

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPAddress.h
# Opt level: O0

string * __thiscall
jaegertracing::net::IPAddress::host_abi_cxx11_(string *__return_storage_ptr__,IPAddress *this)

{
  int __af;
  reference __buf;
  size_type sVar1;
  char *local_a8;
  char *local_90;
  allocator local_59;
  char *local_58;
  char *addrStr;
  undefined1 local_46 [2];
  int af;
  array<char,_46UL> buffer;
  IPAddress *this_local;
  
  buffer._M_elems._38_8_ = this;
  __af = family(this);
  if (__af == 2) {
    local_90 = (this->_addr).__ss_padding + 2;
  }
  else {
    local_90 = (this->_addr).__ss_padding + 6;
  }
  addrStr._4_4_ = __af;
  __buf = std::array<char,_46UL>::operator[]((array<char,_46UL> *)local_46,0);
  sVar1 = std::array<char,_46UL>::size((array<char,_46UL> *)local_46);
  local_58 = inet_ntop(__af,local_90,__buf,(socklen_t)sVar1);
  local_a8 = local_58;
  if (local_58 == (char *)0x0) {
    local_a8 = "";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_a8,&local_59);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  return __return_storage_ptr__;
}

Assistant:

std::string host() const
    {
        std::array<char, INET6_ADDRSTRLEN> buffer;
        const auto af = family();
        const auto* addrStr = ::inet_ntop(
            af,
            af == AF_INET
                ? const_cast<void*>(
                    static_cast<const void*>(
                        &reinterpret_cast<const ::sockaddr_in&>(_addr).sin_addr))
                : const_cast<void*>(
                    static_cast<const void*>(
                        &reinterpret_cast<const ::sockaddr_in6&>(_addr).sin6_addr)),
            &buffer[0],
            buffer.size());
        return addrStr ? addrStr : "";
    }